

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManPoMffcSize(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  Gia_ManCreateRefs(p);
  pGVar2 = Gia_ManPo(p,0);
  iVar1 = Gia_NodeDeref_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
  return iVar1;
}

Assistant:

int Gia_ManPoMffcSize( Gia_Man_t * p )
{
    Gia_ManCreateRefs( p );
    return Gia_NodeDeref_rec( p, Gia_ObjFanin0(Gia_ManPo(p, 0)) );
}